

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O0

void FT_Set_Default_Properties(FT_Library library)

{
  char *pcVar1;
  int local_1dc;
  FT_String local_1d8 [4];
  int i;
  char property_value [129];
  FT_String local_148 [8];
  char property_name [129];
  FT_String local_b8 [8];
  char module_name [129];
  char *q;
  char *p;
  char *env;
  FT_Library library_local;
  
  q = getenv("FREETYPE_PROPERTIES");
  if (q != (char *)0x0) {
    for (; pcVar1 = q, *q != '\0'; q = q + 1) {
      if ((*q != ' ') && (*q != '\t')) {
        local_1dc = 0;
        while (((local_1dc < 0x80 && (*q != '\0')) && (*q != ':'))) {
          local_b8[local_1dc] = *q;
          local_1dc = local_1dc + 1;
          q = q + 1;
        }
        local_b8[local_1dc] = '\0';
        if (*q == '\0') {
          return;
        }
        if (*q != ':') {
          return;
        }
        if (q == pcVar1) {
          return;
        }
        pcVar1 = q + 1;
        local_1dc = 0;
        q = pcVar1;
        while (((local_1dc < 0x80 && (*q != '\0')) && (*q != '='))) {
          local_148[local_1dc] = *q;
          local_1dc = local_1dc + 1;
          q = q + 1;
        }
        local_148[local_1dc] = '\0';
        if (*q == '\0') {
          return;
        }
        if (*q != '=') {
          return;
        }
        if (q == pcVar1) {
          return;
        }
        pcVar1 = q + 1;
        local_1dc = 0;
        q = pcVar1;
        while (((local_1dc < 0x80 && (*q != '\0')) && ((*q != ' ' && (*q != '\t'))))) {
          local_1d8[local_1dc] = *q;
          local_1dc = local_1dc + 1;
          q = q + 1;
        }
        local_1d8[local_1dc] = '\0';
        if (((*q != '\0') && (*q != ' ')) && (*q != '\t')) {
          return;
        }
        if (q == pcVar1) {
          return;
        }
        ft_property_string_set(library,local_b8,local_148,local_1d8);
        if (*q == '\0') {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Set_Default_Properties( FT_Library  library )
  {
    const char*  env;
    const char*  p;
    const char*  q;

    char  module_name[MAX_LENGTH + 1];
    char  property_name[MAX_LENGTH + 1];
    char  property_value[MAX_LENGTH + 1];

    int  i;


    env = ft_getenv( "FREETYPE_PROPERTIES" );
    if ( !env )
      return;

    for ( p = env; *p; p++ )
    {
      /* skip leading whitespace and separators */
      if ( *p == ' ' || *p == '\t' )
        continue;

      /* read module name, followed by `:' */
      q = p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == ':' )
          break;
        module_name[i] = *p++;
      }
      module_name[i] = '\0';

      if ( !*p || *p != ':' || p == q )
        break;

      /* read property name, followed by `=' */
      q = ++p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == '=' )
          break;
        property_name[i] = *p++;
      }
      property_name[i] = '\0';

      if ( !*p || *p != '=' || p == q )
        break;

      /* read property value, followed by whitespace (if any) */
      q = ++p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == ' ' || *p == '\t' )
          break;
        property_value[i] = *p++;
      }
      property_value[i] = '\0';

      if ( !( *p == '\0' || *p == ' ' || *p == '\t' ) || p == q )
        break;

      /* we completely ignore errors */
      ft_property_string_set( library,
                              module_name,
                              property_name,
                              property_value );

      if ( !*p )
        break;
    }
  }